

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::paintEvent(QListView *this,QPaintEvent *e)

{
  bool bVar1;
  uint uVar2;
  QListViewPrivate *this_00;
  Data *pDVar3;
  QWidgetData *pQVar4;
  QAbstractItemModel *pQVar5;
  Data *pDVar6;
  QAbstractItemModel *pQVar7;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  int *piVar8;
  QRect QVar9;
  QRect QVar10;
  undefined1 auVar11 [16];
  QRect QVar12;
  QRect QVar13;
  State SVar14;
  State SVar15;
  uint uVar16;
  QFlagsStorageHelper<QStyle::StateFlag,_4> QVar17;
  bool bVar18;
  char cVar19;
  int iVar20;
  int iVar21;
  LayoutDirection LVar22;
  State SVar23;
  QWidget *pQVar24;
  uint *puVar25;
  ulong uVar26;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar27;
  long *plVar28;
  uint uVar29;
  Representation RVar30;
  QSize QVar31;
  uint *puVar32;
  long in_FS_OFFSET;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  Bucket BVar36;
  uint local_254;
  QModelIndex *local_238;
  QRect local_208;
  undefined8 local_1f8;
  undefined1 *puStack_1f0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1e8;
  undefined8 local_1d8;
  undefined1 *puStack_1d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 *local_1a8;
  undefined1 *local_198;
  QWidget *pQStack_190;
  QStyle *local_188;
  QPersistentModelIndex local_180;
  undefined1 local_178 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 *local_138;
  QPalettePrivate *pQStack_130;
  undefined1 *local_128;
  QObject *pQStack_120;
  undefined1 *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  QVar13._8_8_ = local_148._8_8_;
  QVar13._0_8_ = local_148._0_8_;
  QVar12._8_8_ = local_148._8_8_;
  QVar12._0_8_ = local_148._0_8_;
  auVar11._8_8_ = local_158._8_8_;
  auVar11._0_8_ = local_158._0_8_;
  auVar35._8_8_ = local_158._8_8_;
  auVar35._0_8_ = local_158._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pDVar3 = (this_00->super_QAbstractItemViewPrivate).itemDelegate.wp.d;
  if (((pDVar3 == (Data *)0x0) ||
      (local_158 = auVar35, local_148 = (undefined1  [16])QVar12, *(int *)(pDVar3 + 4) == 0)) ||
     (local_158 = auVar11, local_148 = (undefined1  [16])QVar13,
     (this_00->super_QAbstractItemViewPrivate).itemDelegate.wp.value == (QObject *)0x0))
  goto LAB_00576a71;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&local_108);
  local_188 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_190 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar24 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QPainter::QPainter((QPainter *)&local_198);
  pQStack_190 = pQVar24;
  local_188 = QWidget::style(pQVar24);
  QPainter::begin((QPaintDevice *)&local_198);
  QPainter::setRenderHint((RenderHint)(QPainter *)&local_198,true);
  local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = 0xaaaaaaaa;
  uStack_1b4 = 0xaaaaaaaa;
  uStack_1b0 = 0xaaaaaaaa;
  uStack_1ac = 0xaaaaaaaa;
  iVar20 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                  super_QFrame.super_QWidget + 0x2b0))(this);
  iVar21 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                  super_QFrame.super_QWidget + 0x2b8))(this);
  local_178._4_4_ = *(int *)(e + 0x14) + iVar21;
  local_178._0_4_ = *(int *)(e + 0x10) + iVar20;
  local_178._12_4_ = iVar21 + *(int *)(e + 0x1c);
  local_178._8_4_ = iVar20 + *(int *)(e + 0x18);
  local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  LVar22 = QWidget::layoutDirection
                     (*(QWidget **)
                       &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  local_158 = QRect::normalized();
  uVar26 = local_158._0_8_;
  if (LVar22 == RightToLeft) {
    pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar21 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
    iVar20 = (this_00->commonListView->contentsSize).wd.m_i;
    if (iVar21 <= iVar20) {
      iVar21 = iVar20;
    }
    uVar29 = ~local_158._8_4_ + iVar21;
    local_158._8_8_ =
         (ulong)((local_158._8_4_ - local_158._0_4_) + uVar29) |
         local_158._8_8_ & 0xffffffff00000000;
    local_158._0_8_ = (ulong)uVar29 | uVar26 & 0xffffffff00000000;
  }
  (*this_00->commonListView->_vptr_QCommonListViewBase[7])
            (&local_1b8,this_00->commonListView,local_158);
  local_1c8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_1d8,(QAbstractItemView *)this);
  local_1e8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_1f8,&(this_00->super_QAbstractItemViewPrivate).hover);
  pQVar5 = (this_00->super_QAbstractItemViewPrivate).model;
  pDVar3 = (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    local_238 = (QModelIndex *)0x0;
  }
  else {
    local_238 = (QModelIndex *)(this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value;
  }
  bVar18 = QWidget::hasFocus((QWidget *)this);
  if (bVar18) {
LAB_00576383:
    bVar18 = false;
    if ((-1 < (int)(uint)local_1d8) && (-1 < (long)local_1d8)) {
      bVar18 = local_1c8.ptr != (QAbstractItemModel *)0x0;
    }
  }
  else {
    bVar18 = QWidget::hasFocus((this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.viewport);
    if (bVar18) goto LAB_00576383;
    bVar18 = false;
  }
  SVar14.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_108.super_QStyleOption.state;
  bVar1 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  SVar23 = QAbstractItemView::state((QAbstractItemView *)this);
  iVar20 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                              .super_QWidget.field_0x8 + 0x558);
  pQVar24 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar4 = pQVar24->data;
  QVar31 = this_00->commonListView->contentsSize;
  if (iVar20 == 1) {
    iVar20 = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  }
  else {
    iVar20 = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
    QVar31 = (QSize)((ulong)QVar31 >> 0x20);
  }
  RVar30.m_i = QVar31.wd.m_i.m_i;
  if (QVar31.wd.m_i.m_i < iVar20 + 1) {
    RVar30.m_i = iVar20 + 1;
  }
  if (local_1a8 != (undefined1 *)0x0) {
    iVar20 = RVar30.m_i + this_00->space * -2;
    puVar32 = (uint *)CONCAT44(uStack_1ac,uStack_1b0);
    puVar25 = puVar32 + (long)local_1a8 * 6;
    uVar29 = 0xfffffffe;
    local_254 = 0;
    do {
      auVar35 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x1e0))(this,puVar32);
      local_108.super_QStyleOption.rect.x2.m_i = auVar35._8_4_;
      local_108.super_QStyleOption.rect.y2.m_i = auVar35._12_4_;
      if (*(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget.field_0x8 + 0x558) == 1) {
        local_108.super_QStyleOption.rect.x1.m_i = auVar35._0_4_;
        iVar21 = (local_108.super_QStyleOption.rect.x2.m_i -
                 local_108.super_QStyleOption.rect.x1.m_i) + 1;
        if (iVar20 < iVar21) {
          iVar21 = iVar20;
        }
        local_108.super_QStyleOption.rect.x2.m_i =
             local_108.super_QStyleOption.rect.x1.m_i + iVar21 + -1;
      }
      else {
        local_108.super_QStyleOption.rect.y1.m_i = auVar35._4_4_;
        iVar21 = (local_108.super_QStyleOption.rect.y2.m_i -
                 local_108.super_QStyleOption.rect.y1.m_i) + 1;
        if (iVar20 < iVar21) {
          iVar21 = iVar20;
        }
        local_108.super_QStyleOption.rect.y2.m_i =
             local_108.super_QStyleOption.rect.y1.m_i + iVar21 + -1;
      }
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)SVar14;
      local_108.super_QStyleOption.rect._0_8_ = auVar35._0_8_;
      if (local_238 != (QModelIndex *)0x0) {
        cVar19 = QItemSelectionModel::isSelected(local_238);
        if (cVar19 != '\0') {
          local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorageHelper<QStyle::StateFlag,_4>)
               ((uint)local_108.super_QStyleOption.state.
                      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                      super_QFlagsStorage<QStyle::StateFlag>.i | 0x8000);
        }
      }
      if (((uint)SVar14.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
        uVar26 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,puVar32);
        bVar33 = (uVar26 & 0x20) == 0;
        if (bVar33) {
          local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorageHelper<QStyle::StateFlag,_4>)
               ((uint)local_108.super_QStyleOption.state.
                      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                      super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffffffe);
        }
        local_108.super_QStyleOption.palette.currentGroup = (ColorGroup)bVar33;
      }
      QVar17.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           (QFlagsStorage<QStyle::StateFlag>)local_108.super_QStyleOption.state;
      if (((((bVar18) && ((uint)local_1d8 == *puVar32)) && (local_1d8._4_4_ == puVar32[1])) &&
          ((puStack_1d0 == *(undefined1 **)(puVar32 + 2) &&
           (local_1c8.ptr == *(QAbstractItemModel **)(puVar32 + 4))))) &&
         (QVar17.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               (QFlagsStorage<QStyle::StateFlag>)
               ((uint)local_108.super_QStyleOption.state.
                      super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                      super_QFlagsStorage<QStyle::StateFlag>.i | 0x100), SVar23 == EditingState)) {
        QVar17.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             (QFlagsStorage<QStyle::StateFlag>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i | 0x400100);
      }
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           QVar17.super_QFlagsStorage<QStyle::StateFlag>.i;
      uVar2 = *puVar32;
      if (((uVar2 == (uint)local_1f8) && (puVar32[1] == local_1f8._4_4_)) &&
         ((*(undefined1 **)(puVar32 + 2) == puStack_1f0 &&
          (*(QAbstractItemModel **)(puVar32 + 4) == local_1e8.ptr)))) {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i | 0x2000);
      }
      else {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff);
      }
      if (bVar1 != false) {
        uVar29 = uVar29 + 1;
        uVar16 = local_254;
        if (((uVar2 != uVar29) &&
            (pDVar6 = (this_00->hiddenRows).q_hash.d, uVar16 = uVar2, pDVar6 != (Data *)0x0)) &&
           (pDVar6->size != 0)) {
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          uVar16 = local_254;
          if ((int)uVar29 < (int)uVar2) {
            do {
              local_168.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_178._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar7 = (this_00->super_QAbstractItemViewPrivate).model;
              QPersistentModelIndex::operator_cast_to_QModelIndex
                        ((QModelIndex *)local_158,&(this_00->super_QAbstractItemViewPrivate).root);
              bVar33 = false;
              (**(code **)(*(long *)pQVar7 + 0x60))
                        (local_178,pQVar7,uVar29,0,(QModelIndex *)local_158);
              local_148._0_8_ = local_168.ptr;
              local_158._0_8_ = local_178._0_8_;
              local_158._8_8_ = local_178._8_8_;
              this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                          **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90)
              ;
              if (this_01 !=
                  (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   *)0x0) {
                BVar36 = QHashPrivate::
                         Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         ::findBucket<QtPrivate::QModelIndexWrapper>
                                   (this_01,(QModelIndexWrapper *)local_158);
                if (BVar36.span[BVar36.index] == (Span)0xff) {
                  bVar33 = false;
                }
                else {
                  bVar33 = *(long *)(BVar36.span + 0x80) != 0;
                }
              }
              bVar34 = true;
              if (bVar33) {
                QPersistentModelIndex::QPersistentModelIndex(&local_180,(QModelIndex *)local_178);
                this_02 = (this_00->hiddenRows).q_hash.d;
                if (this_02 !=
                    (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
                  pNVar27 = QHashPrivate::
                            Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                            findNode<QPersistentModelIndex>(this_02,&local_180);
                  bVar34 = pNVar27 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
                }
              }
              if (bVar33) {
                QPersistentModelIndex::~QPersistentModelIndex(&local_180);
              }
              local_254 = (uint)(byte)((byte)local_254 ^ bVar34);
              uVar29 = uVar29 + 1;
              uVar16 = local_254;
            } while (uVar2 != uVar29);
          }
        }
        local_254 = uVar16;
        SVar15.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)local_108.super_QStyleOption.state;
        local_108.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
             (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
             (((uint)local_108.features.
                     super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                     super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd) +
             (local_254 & 1) * 2);
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i & 0xffff7fff);
        (**(code **)(*(long *)local_188 + 0xb0))(local_188,0x2d,&local_108,&local_198,pQStack_190);
        local_254 = local_254 & 0xff ^ 1;
        uVar29 = uVar2;
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)SVar15;
      }
      plVar28 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget
                                    + 0x208))(this,puVar32);
      (**(code **)(*plVar28 + 0x60))(plVar28,&local_198,&local_108,puVar32);
      puVar32 = puVar32 + 6;
    } while (puVar32 != puVar25);
  }
  (*this_00->commonListView->_vptr_QCommonListViewBase[0x14])(this_00->commonListView,&local_198);
  QVar10.x2.m_i = local_148._8_4_;
  QVar10.y2.m_i = local_148._12_4_;
  QVar10.x1.m_i = local_148._0_4_;
  QVar10.y1.m_i = local_148._4_4_;
  QVar9.x2.m_i = local_148._8_4_;
  QVar9.y2.m_i = local_148._12_4_;
  QVar9.x1.m_i = local_148._0_4_;
  QVar9.y1.m_i = local_148._4_4_;
  if (((this_00->showElasticBand != false) &&
      (local_148 = (undefined1  [16])QVar9,
      (this_00->elasticBand).x1.m_i <= (this_00->elasticBand).x2.m_i)) &&
     (local_148 = (undefined1  [16])QVar10,
     (this_00->elasticBand).y1.m_i <= (this_00->elasticBand).y2.m_i)) {
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_120 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)local_158);
    QStyleOption::initFrom((QStyleOption *)local_158,(QWidget *)this);
    local_118 = (undefined1 *)CONCAT35(local_118._5_3_,1);
    local_178 = (undefined1  [16])
                QListViewPrivate::mapToViewport(this_00,&this_00->elasticBand,false);
    pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_208.x2.m_i = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 0x10;
    local_208.y2.m_i = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 0x10;
    local_208.x1.m_i = -0x10;
    local_208.y1.m_i = -0x10;
    local_148 = QRect::operator&((QRect *)local_178,&local_208);
    QPainter::save();
    (**(code **)(*(long *)local_188 + 0xb8))
              (local_188,0x1d,(QStyleOptionRubberBand *)local_158,&local_198,pQStack_190);
    QPainter::restore();
    QStyleOption::~QStyleOption((QStyleOption *)local_158);
  }
  piVar8 = (int *)CONCAT44(uStack_1b4,local_1b8);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_1b4,local_1b8),0x18,0x10);
    }
  }
  QPainter::~QPainter((QPainter *)&local_198);
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
LAB_00576a71:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::paintEvent(QPaintEvent *e)
{
    Q_D(QListView);
    if (!d->itemDelegate)
        return;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QStylePainter painter(d->viewport);

    const QList<QModelIndex> toBeRendered =
            d->intersectingSet(e->rect().translated(horizontalOffset(), verticalOffset()), false);

    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const QAbstractItemModel *itemModel = d->model;
    const QItemSelectionModel *selections = d->selectionModel;
    const bool focus = (hasFocus() || d->viewport->hasFocus()) && current.isValid();
    const bool alternate = d->alternatingColors;
    const QStyle::State state = option.state;
    const QAbstractItemView::State viewState = this->state();
    const bool enabled = (state & QStyle::State_Enabled) != 0;

    bool alternateBase = false;
    int previousRow = -2; // trigger the alternateBase adjustment on first pass

    int maxSize = (flow() == TopToBottom)
        ? qMax(viewport()->size().width(), d->contentsSize().width()) - 2 * d->spacing()
        : qMax(viewport()->size().height(), d->contentsSize().height()) - 2 * d->spacing();

    QList<QModelIndex>::const_iterator end = toBeRendered.constEnd();
    for (QList<QModelIndex>::const_iterator it = toBeRendered.constBegin(); it != end; ++it) {
        Q_ASSERT((*it).isValid());
        option.rect = visualRect(*it);

        if (flow() == TopToBottom)
            option.rect.setWidth(qMin(maxSize, option.rect.width()));
        else
            option.rect.setHeight(qMin(maxSize, option.rect.height()));

        option.state = state;
        if (selections && selections->isSelected(*it))
            option.state |= QStyle::State_Selected;
        if (enabled) {
            QPalette::ColorGroup cg;
            if ((itemModel->flags(*it) & Qt::ItemIsEnabled) == 0) {
                option.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else {
                cg = QPalette::Normal;
            }
            option.palette.setCurrentColorGroup(cg);
        }
        if (focus && current == *it) {
            option.state |= QStyle::State_HasFocus;
            if (viewState == EditingState)
                option.state |= QStyle::State_Editing;
        }
        option.state.setFlag(QStyle::State_MouseOver, *it == hover);

        if (alternate) {
            int row = (*it).row();
            if (row != previousRow + 1) {
                // adjust alternateBase according to rows in the "gap"
                if (!d->hiddenRows.isEmpty()) {
                    for (int r = qMax(previousRow + 1, 0); r < row; ++r) {
                        if (!d->isHidden(r))
                            alternateBase = !alternateBase;
                    }
                } else {
                    alternateBase = (row & 1) != 0;
                }
            }
            option.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = option.state;
            option.state &= ~QStyle::State_Selected;
            painter.drawPrimitive(QStyle::PE_PanelItemViewRow, option);
            option.state = oldState;

            alternateBase = !alternateBase;
            previousRow = row;
        }

        itemDelegateForIndex(*it)->paint(&painter, option, *it);
    }

#if QT_CONFIG(draganddrop)
    d->commonListView->paintDragDrop(&painter);
#endif

#if QT_CONFIG(rubberband)
    // #### move this implementation into a dynamic class
    if (d->showElasticBand && d->elasticBand.isValid()) {
        QStyleOptionRubberBand opt;
        opt.initFrom(this);
        opt.shape = QRubberBand::Rectangle;
        opt.opaque = false;
        opt.rect = d->mapToViewport(d->elasticBand, false).intersected(
            d->viewport->rect().adjusted(-16, -16, 16, 16));
        painter.save();
        painter.drawControl(QStyle::CE_RubberBand, opt);
        painter.restore();
    }
#endif
}